

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall llvm::DWARFVerifier::verifyNameIndexAbbrevs(DWARFVerifier *this,NameIndex *NI)

{
  AttributeEncoding *pAVar1;
  uint uVar2;
  raw_ostream *prVar3;
  pair<llvm::NoneType,_bool> pVar4;
  size_type sVar5;
  uint uVar6;
  undefined1 Abbr [8];
  AttributeEncoding *Vals_2;
  StringRef SVar7;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>_>
  local_138;
  undefined1 local_c8 [8];
  const_iterator __begin1;
  SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> Attributes;
  uint64_t local_48;
  DWARFVerifier *local_40;
  Index local_38;
  uint local_34;
  
  if ((NI->Hdr).super_HeaderPOD.LocalTypeUnitCount + (NI->Hdr).super_HeaderPOD.ForeignTypeUnitCount
      == 0) {
    local_40 = this;
    _local_c8 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                ::begin((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                         *)NI);
    Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)((NI->Abbrevs).
                  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                  .TheMap.Buckets +
                 (NI->Abbrevs).
                 super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                 .TheMap.NumBuckets);
    local_34 = 0;
    Abbr = (undefined1  [8])&local_c8->key;
    while (Abbr != (undefined1  [8])Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count)
    {
      SVar7 = dwarf::TagString((uint)((Abbrev *)Abbr)->Tag);
      if (SVar7.Length == 0) {
        prVar3 = warn(local_40);
        __begin1.I.End = (pointer)NI->Base;
        formatv<unsigned_long,_const_unsigned_int_&,_const_llvm::dwarf::Tag_&>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
                    *)&local_138,
                   "NameIndex @ {0:x}: Abbreviation {1:x} references an unknown tag: {2}.\n",
                   (unsigned_long *)&__begin1.I.End,(uint *)Abbr,&((Abbrev *)Abbr)->Tag);
        raw_ostream::operator<<(prVar3,&local_138.super_formatv_object_base);
        formatv_object_base::~formatv_object_base(&local_138.super_formatv_object_base);
      }
      __begin1.I.End =
           (pointer)&Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
                     super_SmallVectorTemplateBase<unsigned_int,_true>.
                     super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
      Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
      super_SmallVectorTemplateBase<unsigned_int,_true>.
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX =
           (void *)0x500000000;
      Attributes.Set._M_t._M_impl._0_4_ = 0;
      Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&Attributes.Set;
      Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      pAVar1 = (((Abbrev *)Abbr)->Attributes).
               super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = local_34;
      Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      for (Vals_2 = (((Abbrev *)Abbr)->Attributes).
                    super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                    ._M_impl.super__Vector_impl_data._M_start; Vals_2 != pAVar1; Vals_2 = Vals_2 + 1
          ) {
        local_138.super_formatv_object_base.Fmt.Data._0_4_ = Vals_2->Index;
        pVar4 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::insert
                          ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__begin1.I.End,
                           (uint *)&local_138);
        if (((ulong)pVar4 >> 0x20 & 1) == 0) {
          prVar3 = error(local_40);
          local_48 = NI->Base;
          formatv<unsigned_long,_const_unsigned_int_&,_const_llvm::dwarf::Index_&>
                    (&local_138,
                     "NameIndex @ {0:x}: Abbreviation {1:x} contains multiple {2} attributes.\n",
                     &local_48,(uint *)Abbr,&Vals_2->Index);
          raw_ostream::operator<<(prVar3,&local_138.super_formatv_object_base);
          formatv_object_base::~formatv_object_base(&local_138.super_formatv_object_base);
          uVar6 = uVar6 + 1;
        }
        else {
          uVar2 = verifyNameIndexAttribute(local_40,NI,(Abbrev *)Abbr,*Vals_2);
          uVar6 = uVar6 + uVar2;
        }
      }
      local_34 = uVar6;
      if (1 < (NI->Hdr).super_HeaderPOD.CompUnitCount) {
        local_138.super_formatv_object_base.Fmt.Data._0_4_ = 1;
        sVar5 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
                          ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__begin1.I.End,
                           (uint *)&local_138);
        if (sVar5 == 0) {
          prVar3 = error(local_40);
          local_48 = NI->Base;
          local_38 = DW_IDX_compile_unit;
          formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index>
                    ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
                      *)&local_138,
                     "NameIndex @ {0:x}: Indexing multiple compile units and abbreviation {1:x} has no {2} attribute.\n"
                     ,&local_48,(uint *)Abbr,&local_38);
          raw_ostream::operator<<(prVar3,&local_138.super_formatv_object_base);
          formatv_object_base::~formatv_object_base(&local_138.super_formatv_object_base);
          local_34 = local_34 + 1;
        }
      }
      local_138.super_formatv_object_base.Fmt.Data._0_4_ = 3;
      sVar5 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
                        ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__begin1.I.End,
                         (uint *)&local_138);
      if (sVar5 == 0) {
        prVar3 = error(local_40);
        local_48 = NI->Base;
        local_38 = DW_IDX_die_offset;
        formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
                    *)&local_138,"NameIndex @ {0:x}: Abbreviation {1:x} has no {2} attribute.\n",
                   &local_48,(uint *)Abbr,&local_38);
        raw_ostream::operator<<(prVar3,&local_138.super_formatv_object_base);
        formatv_object_base::~formatv_object_base(&local_138.super_formatv_object_base);
        local_34 = local_34 + 1;
      }
      SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::~SmallSet
                ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__begin1.I.End);
      DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
      ::operator++((DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
                    *)local_c8);
      Abbr = local_c8;
    }
  }
  else {
    prVar3 = warn(this);
    __begin1.I.End = (pointer)NI->Base;
    formatv<unsigned_long>
              ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_> *
               )&local_138,
               "Name Index @ {0:x}: Verifying indexes of type units is not currently supported.\n",
               (unsigned_long *)&__begin1.I.End);
    raw_ostream::operator<<(prVar3,&local_138.super_formatv_object_base);
    formatv_object_base::~formatv_object_base(&local_138.super_formatv_object_base);
    local_34 = 0;
  }
  return local_34;
}

Assistant:

unsigned
DWARFVerifier::verifyNameIndexAbbrevs(const DWARFDebugNames::NameIndex &NI) {
  if (NI.getLocalTUCount() + NI.getForeignTUCount() > 0) {
    warn() << formatv("Name Index @ {0:x}: Verifying indexes of type units is "
                      "not currently supported.\n",
                      NI.getUnitOffset());
    return 0;
  }

  unsigned NumErrors = 0;
  for (const auto &Abbrev : NI.getAbbrevs()) {
    StringRef TagName = dwarf::TagString(Abbrev.Tag);
    if (TagName.empty()) {
      warn() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} references an "
                        "unknown tag: {2}.\n",
                        NI.getUnitOffset(), Abbrev.Code, Abbrev.Tag);
    }
    SmallSet<unsigned, 5> Attributes;
    for (const auto &AttrEnc : Abbrev.Attributes) {
      if (!Attributes.insert(AttrEnc.Index).second) {
        error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} contains "
                           "multiple {2} attributes.\n",
                           NI.getUnitOffset(), Abbrev.Code, AttrEnc.Index);
        ++NumErrors;
        continue;
      }
      NumErrors += verifyNameIndexAttribute(NI, Abbrev, AttrEnc);
    }

    if (NI.getCUCount() > 1 && !Attributes.count(dwarf::DW_IDX_compile_unit)) {
      error() << formatv("NameIndex @ {0:x}: Indexing multiple compile units "
                         "and abbreviation {1:x} has no {2} attribute.\n",
                         NI.getUnitOffset(), Abbrev.Code,
                         dwarf::DW_IDX_compile_unit);
      ++NumErrors;
    }
    if (!Attributes.count(dwarf::DW_IDX_die_offset)) {
      error() << formatv(
          "NameIndex @ {0:x}: Abbreviation {1:x} has no {2} attribute.\n",
          NI.getUnitOffset(), Abbrev.Code, dwarf::DW_IDX_die_offset);
      ++NumErrors;
    }
  }
  return NumErrors;
}